

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

void upb_Array_Set(upb_Array *arr,size_t i,upb_MessageValue val)

{
  _Bool _Var1;
  size_t sVar2;
  void *pvVar3;
  int lg2;
  char *data;
  size_t i_local;
  upb_Array *arr_local;
  upb_MessageValue val_local;
  
  val_local.int64_val = val.str_val.size;
  arr_local = val.array_val;
  _Var1 = upb_Array_IsFrozen(arr);
  if (_Var1) {
    __assert_fail("!upb_Array_IsFrozen(arr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/message/array.c"
                  ,0x30,"void upb_Array_Set(upb_Array *, size_t, upb_MessageValue)");
  }
  sVar2 = upb_Array_Size(arr);
  if (i < sVar2) {
    pvVar3 = upb_Array_MutableDataPtr(arr);
    sVar2 = _upb_Array_ElemSizeLg2_dont_copy_me__upb_internal_use_only(arr);
    memcpy((void *)((long)pvVar3 + (i << ((byte)sVar2 & 0x3f))),&arr_local,
           (long)(1 << ((byte)sVar2 & 0x1f)));
    return;
  }
  __assert_fail("i < upb_Array_Size(arr)",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/message/array.c"
                ,0x31,"void upb_Array_Set(upb_Array *, size_t, upb_MessageValue)");
}

Assistant:

void upb_Array_Set(upb_Array* arr, size_t i, upb_MessageValue val) {
  UPB_ASSERT(!upb_Array_IsFrozen(arr));
  UPB_ASSERT(i < upb_Array_Size(arr));
  char* data = upb_Array_MutableDataPtr(arr);
  const int lg2 = UPB_PRIVATE(_upb_Array_ElemSizeLg2)(arr);
  memcpy(data + (i << lg2), &val, 1 << lg2);
}